

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t __thiscall
httplib::Server::create_server_socket
          (Server *this,string *host,int port,int socket_flags,SocketOptions *socket_options)

{
  byte bVar1;
  undefined4 uVar2;
  socket_t sVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  function<void_(int)> *in_stack_ffffffffffffff38;
  function<void_(int)> *in_stack_ffffffffffffff40;
  undefined1 local_60 [32];
  string local_40 [40];
  undefined4 local_18;
  undefined4 local_14;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  std::__cxx11::string::string(local_40);
  uVar2 = *(undefined4 *)(in_RDI + 0x2b8);
  bVar1 = *(byte *)(in_RDI + 700);
  std::function<void_(int)>::function(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  sVar3 = detail::
          create_socket<httplib::Server::create_server_socket(std::__cxx11::string_const&,int,int,std::function<void(int)>)const::_lambda(int,addrinfo&)_1_>
                    (in_RSI,local_40,local_14,uVar2,local_18,bVar1 & 1,local_60);
  std::function<void_(int)>::~function((function<void_(int)> *)0x19b832);
  std::__cxx11::string::~string(local_40);
  return sVar3;
}

Assistant:

inline socket_t
Server::create_server_socket(const std::string &host, int port,
                             int socket_flags,
                             SocketOptions socket_options) const {
  return detail::create_socket(
      host, std::string(), port, address_family_, socket_flags, tcp_nodelay_,
      std::move(socket_options),
      [](socket_t sock, struct addrinfo &ai) -> bool {
        if (::bind(sock, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen))) {
          return false;
        }
        if (::listen(sock, CPPHTTPLIB_LISTEN_BACKLOG)) { return false; }
        return true;
      });
}